

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateWhile(ExpressionEvalContext *ctx,ExprWhile *expression)

{
  StackFrame *pSVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  longlong in_RAX;
  StackFrame **ppSVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  longlong result;
  
  result = in_RAX;
  ppSVar8 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar8;
  while( true ) {
    bVar5 = AddInstruction(ctx);
    if (!bVar5) {
      return (ExprBase *)0x0;
    }
    if (pSVar1->targetYield == 0) {
      pEVar9 = Evaluate(ctx,expression->condition);
      if (pEVar9 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      bVar5 = TryTakeLong(pEVar9,&result);
      if (!bVar5) {
        Report(ctx,"ERROR: failed to evaluate \'while\' condition");
        return (ExprBase *)0x0;
      }
      if (result == 0) goto LAB_0023100d;
    }
    pEVar9 = Evaluate(ctx,expression->body);
    if (pEVar9 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if (pSVar1->breakDepth != 0) break;
    if (((pSVar1->continueDepth != 0) &&
        (uVar6 = pSVar1->continueDepth - 1, pSVar1->continueDepth = uVar6, uVar6 != 0)) ||
       (pSVar1->returnValue != (ExprBase *)0x0)) goto LAB_0023100d;
  }
  pSVar1->breakDepth = pSVar1->breakDepth - 1;
LAB_0023100d:
  pAVar2 = ctx->ctx->allocator;
  iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar7);
  pSVar3 = (expression->super_ExprBase).source;
  pTVar4 = ctx->ctx->typeVoid;
  pEVar9->typeID = 2;
  pEVar9->source = pSVar3;
  pEVar9->type = pTVar4;
  pEVar9->next = (ExprBase *)0x0;
  pEVar9->listed = false;
  pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
  pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
  return pEVar9;
}

Assistant:

ExprBase* EvaluateWhile(ExpressionEvalContext &ctx, ExprWhile *expression)
{
	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(;;)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!frame->targetYield)
		{
			ExprBase *condition = Evaluate(ctx, expression->condition);

			if(!condition)
				return NULL;

			long long result;
			if(!TryTakeLong(condition, result))
				return Report(ctx, "ERROR: failed to evaluate 'while' condition");

			if(!result)
				break;
		}

		if(!Evaluate(ctx, expression->body))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;
			break;
		}

		// On continue, decrease depth and proceed to next iteration, unless it's a multi-level continue
		if(frame->continueDepth)
		{
			frame->continueDepth--;

			if(frame->continueDepth)
				break;
		}

		if(frame->returnValue)
			break;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}